

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_service.h
# Opt level: O0

t_function * __thiscall t_service::get_function_by_name(t_service *this,string *func_name)

{
  t_service *this_00;
  bool bVar1;
  __type _Var2;
  t_function *ptVar3;
  reference pptVar4;
  string *__lhs;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_78;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_70;
  t_function **local_68;
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_60;
  const_iterator iter;
  string local_48;
  t_function *local_28;
  t_function *func;
  string *func_name_local;
  t_service *this_local;
  
  func = (t_function *)func_name;
  func_name_local = (string *)this;
  if (this->extends_ != (t_service *)0x0) {
    local_28 = (t_function *)0x0;
    this_00 = this->extends_;
    std::__cxx11::string::string((string *)&local_48,(string *)func_name);
    ptVar3 = get_function_by_name(this_00,&local_48);
    local_28 = ptVar3;
    std::__cxx11::string::~string((string *)&local_48);
    if (ptVar3 != (t_function *)0x0) {
      return local_28;
    }
  }
  __gnu_cxx::
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  ::__normal_iterator(&local_60);
  local_70._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin(&this->functions_);
  __gnu_cxx::
  __normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>::
  __normal_iterator<t_function**>
            ((__normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>
              *)&local_68,&local_70);
  local_60._M_current = local_68;
  while( true ) {
    local_78._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end(&this->functions_);
    bVar1 = __gnu_cxx::operator!=(&local_60,&local_78);
    if (!bVar1) {
      return (t_function *)0x0;
    }
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_60);
    __lhs = t_function::get_name_abi_cxx11_(*pptVar4);
    _Var2 = std::operator==(__lhs,func_name);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::operator++(&local_60);
  }
  pptVar4 = __gnu_cxx::
            __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
            ::operator*(&local_60);
  return *pptVar4;
}

Assistant:

t_function* get_function_by_name(std::string func_name) {
    if (extends_ != NULL) {
      t_function* func = NULL;
      if ((func = extends_->get_function_by_name(func_name)) != NULL) {
        return func;
      }
    }

    std::vector<t_function*>::const_iterator iter;
    for (iter = functions_.begin(); iter != functions_.end(); ++iter) {
      if ((*iter)->get_name() == func_name) {
        return *iter;
      }
    }
    return NULL;
  }